

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

void __thiscall ent::roots::roots(roots *this,uint32_t id,ByteVector *data)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  string local_48;
  
  *(undefined2 *)&(this->super_base).super_MemoryReader.super_ReadWriter._readonly = 0;
  (this->super_base).super_MemoryReader._mem = (uint8_t *)0x0;
  (this->super_base).super_MemoryReader._size = 0;
  (this->super_base).super_MemoryReader._curpos = 0;
  (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__base_0013c630;
  (this->super_base)._id = id;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&(this->super_base)._data,data)
  ;
  puVar1 = (this->super_base)._data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_base)._data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_base).super_MemoryReader._mem = puVar1;
  (this->super_base).super_MemoryReader._size = (long)puVar2 - (long)puVar1;
  (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__roots_0013cf78;
  (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_lasts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_lasts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_lasts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectorread32le<ent::roots*>(this,&this->_roots,8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->_lasts,8);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_pred<ent::roots::roots(unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_>>
                    ((this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 3,
                     (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var3._M_current !=
      (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    hexdump<unsigned_int*>
              (&local_48,
               (this->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 3,5,1,ET_LITTLEENDIAN);
    printf("WARNING: more roots: %s\n",local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

roots(uint32_t id, const ByteVector& data)
        : base(id, data)
    {
        vectorread32le(this, _roots, 8);
        _lasts.resize(8); // note: not updated
        auto i= std::find_if(_roots.begin()+3, _roots.end(), [](uint32_t x) { return x!=0; });
        if (i!=_roots.end())
            printf("WARNING: more roots: %s\n", hexdump(&_roots[3], 5).c_str());

    }